

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O1

UINT8 CPConv_StrConvert(CPCONV *cpc,size_t *outSize,char **outStr,size_t inSize,char *inStr)

{
  int iVar1;
  bool bVar2;
  char **ppcVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  UINT8 UVar9;
  long lVar10;
  char *outPtr;
  size_t remBytesIn;
  size_t remBytesOut;
  char *inPtr;
  char *local_68;
  size_t local_60;
  char **local_58;
  size_t local_50;
  char *local_48;
  size_t *local_40;
  char *local_38;
  
  local_58 = outStr;
  iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
  if (inSize == 0) {
    sVar8 = cpc->cpfCharSize;
    if (sVar8 == 1) {
      sVar4 = strlen(inStr);
    }
    else if (sVar8 == 2) {
      sVar5 = 0xfffffffffffffffe;
      do {
        sVar4 = sVar5 + 2;
        lVar10 = sVar5 + 2;
        sVar5 = sVar4;
      } while (*(short *)(inStr + lVar10) != 0);
    }
    else if (sVar8 == 4) {
      sVar5 = 0xfffffffffffffffc;
      do {
        sVar4 = sVar5 + 4;
        lVar10 = sVar5 + 4;
        sVar5 = sVar4;
      } while (*(int *)(inStr + lVar10) != 0);
    }
    else {
      sVar4 = 0;
    }
    inSize = sVar4 + sVar8;
  }
  ppcVar3 = local_58;
  local_40 = outSize;
  if (inSize == 0) {
    sVar8 = 0;
    UVar9 = '\0';
  }
  else {
    local_38 = *local_58;
    local_60 = inSize;
    local_48 = inStr;
    if (local_38 == (char *)0x0) {
      sVar4 = (inSize * cpc->cptCharSize * 3 >> 1) / cpc->cpfCharSize;
      pcVar7 = (char *)malloc(sVar4);
      *ppcVar3 = pcVar7;
    }
    else {
      sVar4 = *outSize;
    }
    local_68 = *ppcVar3;
    local_50 = sVar4;
    sVar5 = iconv(cpc->hIConv,&local_48,&local_60,&local_68,&local_50);
    UVar9 = '\0';
    pcVar7 = (char *)0x0;
    do {
      if (sVar5 != 0xffffffffffffffff) break;
      piVar6 = __errno_location();
      ppcVar3 = local_58;
      iVar1 = *piVar6;
      if ((iVar1 == 0x54) || (iVar1 == 0x16)) {
        UVar9 = 0x80;
        sVar5 = 0xffffffffffffffff;
        bVar2 = false;
        if ((iVar1 == 0x16) && (bVar2 = false, local_60 < 2)) {
          bVar2 = false;
          iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,&local_68,&local_50);
          UVar9 = '\x01';
        }
      }
      else {
        sVar5 = 0xffffffffffffffff;
        if (local_38 == (char *)0x0) {
          if (pcVar7 != local_68) {
            lVar10 = (long)local_68 - (long)*local_58;
            sVar4 = sVar4 + local_60 * 2;
            pcVar7 = (char *)realloc(*local_58,sVar4);
            *ppcVar3 = pcVar7;
            pcVar7 = pcVar7 + lVar10;
            local_50 = sVar4 - lVar10;
            local_68 = pcVar7;
            sVar5 = iconv(cpc->hIConv,&local_48,&local_60,&local_68,&local_50);
            bVar2 = true;
            goto LAB_0016e483;
          }
          UVar9 = 0xf0;
        }
        else {
          UVar9 = '\x10';
        }
        bVar2 = false;
      }
LAB_0016e483:
    } while (bVar2);
    sVar8 = (long)local_68 - (long)*local_58;
  }
  *local_40 = sVar8;
  return UVar9;
}

Assistant:

UINT8 CPConv_StrConvert(CPCONV* cpc, size_t* outSize, char** outStr, size_t inSize, const char* inStr)
{
	size_t outBufSize;
	size_t remBytesIn;
	size_t remBytesOut;
	char* inPtr;
	char* outPtr;
	size_t wrtBytes;
	char resVal;
	UINT8 canRealloc;
	char* outPtrPrev;
	
	iconv(cpc->hIConv, NULL, NULL, NULL, NULL);	// reset conversion state
	
	if (! inSize)
		inSize = GetStrSize(inStr, cpc->cpfCharSize) + cpc->cpfCharSize;	// include \0 terminator
	remBytesIn = inSize;
	inPtr = (char*)&inStr[0];	// const-cast due to a bug in the iconv API
	if (remBytesIn == 0)
	{
		*outSize = 0;
		return 0x00;	// nothing to convert
	}
	
	if (*outStr == NULL)
	{
		outBufSize = remBytesIn * cpc->cptCharSize * 3 / 2 / cpc->cpfCharSize;
		*outStr = (char*)malloc(outBufSize);
		canRealloc = 1;
	}
	else
	{
		outBufSize = *outSize;
		canRealloc = 0;
	}
	remBytesOut = outBufSize;
	outPtr = *outStr;
	
	resVal = 0x00;	// default: conversion successfull
	outPtrPrev = NULL;
	wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	while(wrtBytes == (size_t)-1)
	{
		int err = errno;
		if (err == EILSEQ || err == EINVAL)
		{
			// invalid encoding
			resVal = 0x80;
			if (err == EINVAL && remBytesIn <= 1)
			{
				// assume that the string got truncated
				iconv(cpc->hIConv, NULL, NULL, &outPtr, &remBytesOut);
				resVal = 0x01;	// conversion incomplete due to input error
			}
			break;
		}
		// err == E2BIG
		if (! canRealloc)
		{
			resVal = 0x10;	// conversion incomplete due to lack of buffer space
			break;
		}
		if (outPtrPrev == outPtr)
		{
			resVal = 0xF0;	// unexpected conversion error
			break;
		}
		wrtBytes = outPtr - *outStr;
		outBufSize += remBytesIn * 2;
		*outStr = (char*)realloc(*outStr, outBufSize);
		outPtr = *outStr + wrtBytes;
		remBytesOut = outBufSize - wrtBytes;
		
		outPtrPrev = outPtr;
		wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	}
	
	*outSize = outPtr - *outStr;
	return resVal;
}